

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86internal.cpp
# Opt level: O3

Error asmjit::X86Internal::emitArgMove
                (X86Emitter *emitter,X86Reg *dst_,uint32_t dstTypeId,Operand_ *src_,
                uint32_t srcTypeId,bool avxEnabled,char *comment)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  Reg *pRVar4;
  anon_union_16_7_ed616b9d_for_Operand__0 aVar5;
  uint uVar6;
  undefined4 uVar7;
  Error EVar8;
  undefined4 uVar9;
  ulong o1;
  uint32_t uVar10;
  uint32_t instId;
  uint32_t uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  bool bVar17;
  X86Reg dst;
  anon_union_16_7_ed616b9d_for_Operand__0 aStack_e0;
  anon_union_16_7_ed616b9d_for_Operand__0 aStack_d0;
  anon_union_16_7_ed616b9d_for_Operand__0 aStack_c0;
  anon_union_16_7_ed616b9d_for_Operand__0 aStack_b0;
  anon_union_16_7_ed616b9d_for_Operand__0 aStack_98;
  anon_union_16_7_ed616b9d_for_Operand__0 aStack_88;
  anon_union_16_7_ed616b9d_for_Operand__0 local_48;
  anon_union_16_7_ed616b9d_for_Operand__0 local_38;
  
  if (dstTypeId == 0) {
    dstTypeId = (uint32_t)
                (byte)x86OpData[(ulong)((dst_->super_Reg).super_Operand.super_Operand_.field_0._any.
                                        signature >> 3 & 0x1f) + 0xa0];
  }
  if ((0x44 < dstTypeId - 0x20) || ((dstTypeId & 0x7e) == 0x20)) {
    emitArgMove();
LAB_0012271c:
    emitArgMove();
    uVar6 = (dst_->super_Reg).super_Operand.super_Operand_.field_0._any.id;
    pRVar4 = ((CodeEmitter *)emitter)->_nativeGpArray;
    aStack_e0._packed[0] = *(UInt64 *)(pRVar4 + 4);
    aStack_e0._mem.field_2 = pRVar4[4].super_Operand.super_Operand_.field_0._mem.field_2;
    aStack_c0._mem.field_2 = pRVar4[4].super_Operand.super_Operand_.field_0._mem.field_2;
    aStack_c0._any.signature =
         (uint32_t)*(undefined8 *)&pRVar4[4].super_Operand.super_Operand_.field_0;
    aStack_c0._any.id = 5;
    aStack_b0._packed[0] = (UInt64)((UInt64 *)(pRVar4 + 4))->field_11;
    aStack_b0._mem.field_2 = pRVar4[4].super_Operand.super_Operand_.field_0._mem.field_2;
    aStack_d0._packed[0] = (UInt64)((UInt64 *)(pRVar4 + 4))->field_11;
    aStack_d0._mem.field_2 = pRVar4[4].super_Operand.super_Operand_.field_0._mem.field_2;
    if ((undefined1  [16])
        ((undefined1  [16])dst_[1].super_Reg.super_Operand.super_Operand_.field_0 &
        (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      EVar8 = CodeEmitter::emit((CodeEmitter *)emitter,0x263,(Operand_ *)&aStack_c0._any);
      if (EVar8 != 0) {
        return EVar8;
      }
      EVar8 = CodeEmitter::emit((CodeEmitter *)emitter,0x189,(Operand_ *)&aStack_c0._any,
                                (Operand_ *)&aStack_e0._any);
      if (EVar8 != 0) {
        return EVar8;
      }
      uVar6 = uVar6 & 0xffffffdf;
    }
    if (uVar6 != 0) {
      iVar16 = 0;
      do {
        if ((uVar6 & 1) != 0) {
          aStack_b0._any.id = iVar16;
          EVar8 = CodeEmitter::emit((CodeEmitter *)emitter,0x263,(Operand_ *)&aStack_b0._any);
          if (EVar8 != 0) {
            return EVar8;
          }
        }
        iVar16 = iVar16 + 1;
        bVar17 = 1 < uVar6;
        uVar6 = uVar6 >> 1;
      } while (bVar17);
    }
    cVar3 = *(char *)((long)&(dst_->super_Reg).super_Operand.super_Operand_.field_0 + 2);
    if ((cVar3 != '\x04') && (cVar3 != -1)) {
      aStack_d0._any.id._0_1_ = cVar3;
      aStack_d0._any.id._1_3_ = 0;
      if (((cVar3 != '\x05') ||
          ((undefined1  [16])
           ((undefined1  [16])dst_[1].super_Reg.super_Operand.super_Operand_.field_0 &
           (undefined1  [16])0x100000000) == (undefined1  [16])0x0)) &&
         (EVar8 = CodeEmitter::emit((CodeEmitter *)emitter,0x189,(Operand_ *)&aStack_d0._any,
                                    (Operand_ *)&aStack_e0._any), EVar8 != 0)) {
        return EVar8;
      }
    }
    if ((((undefined1  [16])
          ((undefined1  [16])dst_[1].super_Reg.super_Operand.super_Operand_.field_0 &
          (undefined1  [16])0x800000000) == (undefined1  [16])0x0) ||
        (EVar8 = CodeEmitter::emit((CodeEmitter *)emitter,0x15,(Operand_ *)&aStack_e0._any,
                                   -(uint)*(byte *)&(dst_->super_Reg).super_Operand.super_Operand_.
                                                    field_0), EVar8 == 0)) &&
       ((o1 = (ulong)dst_[2].super_Reg.super_Operand.super_Operand_.field_0._any.signature, o1 == 0
        || (EVar8 = CodeEmitter::emit((CodeEmitter *)emitter,0x2c4,(Operand_ *)&aStack_e0._any,o1),
           EVar8 == 0)))) {
      if ((~*(byte *)((long)&dst_[1].super_Reg.super_Operand.super_Operand_.field_0 + 4) & 10) == 0)
      {
        aStack_98._any.reserved8_4 =
             dst_[2].super_Reg.super_Operand.super_Operand_.field_0._any.reserved8_4;
        aStack_98._packed[0] = (UInt64)((ulong)(aStack_e0._any.signature & 0xf8) | 2);
        aStack_98._any.reserved12_4 = aStack_e0._any.id;
        EVar8 = CodeEmitter::emit((CodeEmitter *)emitter,0x189,(Operand_ *)&aStack_98._any,
                                  (Operand_ *)&aStack_d0._any);
        if (EVar8 != 0) {
          return EVar8;
        }
      }
      uVar11 = (dst_->super_Reg).super_Operand.super_Operand_.field_0._any.reserved8_4;
      if (uVar11 != 0) {
        aStack_98._any.reserved8_4 =
             dst_[3].super_Reg.super_Operand.super_Operand_.field_0._any.reserved8_4;
        aStack_98._packed[0] = (UInt64)((ulong)(aStack_e0._any.signature & 0xf8) | 2);
        aStack_98._any.reserved12_4 = aStack_e0._any.id;
        aStack_88._packed[0] = (UInt64)0x10000149;
        aStack_88._mem.field_2 = (anon_union_8_2_78723da6_for_MemData_2)0x0;
        aVar5 = dst_[1].super_Reg.super_Operand.super_Operand_.field_0;
        bVar17 = (undefined1  [16])((undefined1  [16])aVar5 & (undefined1  [16])0x4000000000) ==
                 (undefined1  [16])0x0;
        uVar10 = 0x3de;
        if (bVar17) {
          uVar10 = 0x18b;
        }
        instId = 0x3fb;
        if (bVar17) {
          instId = 0x1ac;
        }
        if ((undefined1  [16])((undefined1  [16])aVar5 & (undefined1  [16])0x400000000) !=
            (undefined1  [16])0x0) {
          instId = uVar10;
        }
        iVar16 = 0;
        do {
          if ((uVar11 & 1) != 0) {
            aStack_88._any.id = iVar16;
            EVar8 = CodeEmitter::emit((CodeEmitter *)emitter,instId,(Operand_ *)&aStack_98._any,
                                      (Operand_ *)&aStack_88._any);
            if (EVar8 != 0) {
              return EVar8;
            }
            aStack_98._any.reserved8_4 = aStack_98._any.reserved8_4 + 0x10;
          }
          iVar16 = iVar16 + 1;
          bVar17 = 1 < uVar11;
          uVar11 = uVar11 >> 1;
        } while (bVar17);
      }
      EVar8 = 0;
    }
    return EVar8;
  }
  uVar6 = srcTypeId - 0x20;
  if ((0x44 < uVar6) || ((srcTypeId & 0x7e) == 0x20)) goto LAB_0012271c;
  local_38._packed[0] =
       (UInt64)*(undefined8 *)&(dst_->super_Reg).super_Operand.super_Operand_.field_0;
  local_38._mem.field_2 = (dst_->super_Reg).super_Operand.super_Operand_.field_0._mem.field_2;
  local_48._packed[0] = (UInt64)*(undefined8 *)&src_->field_0;
  local_48._mem.field_2 = (src_->field_0)._mem.field_2;
  bVar1 = TypeId::_info[dstTypeId];
  bVar2 = TypeId::_info[srcTypeId];
  uVar14 = (uint)bVar2;
  uVar12 = (uint)bVar1;
  uVar15 = (uint)bVar2;
  uVar13 = uVar14;
  if (dstTypeId - 0x20 < 10) {
    if (uVar6 < 10) {
      uVar6 = dstTypeId << 8 | srcTypeId;
      uVar11 = 0x1a9;
      if ((int)uVar6 < 0x2822) {
        uVar13 = (uint)bVar2;
        if (((uVar6 == 0x2422) || (uVar13 = uVar14, uVar6 == 0x2622)) || (uVar6 == 0x2624))
        goto LAB_0012261d;
      }
      else {
        if ((uVar6 == 0x2822) || (uVar6 == 0x2824)) goto LAB_0012261d;
        if (uVar6 == 0x2826) {
          uVar11 = 0x1aa;
          goto LAB_0012261d;
        }
      }
    }
    else if (((src_->field_0)._any.signature & 7) != 2) {
      if (uVar12 < uVar15) {
        bVar2 = bVar1;
      }
      uVar6 = (uint)bVar2;
      uVar13 = uVar6;
      if (1 < srcTypeId - 0x31) {
        if (srcTypeId - 0x2d < 4) {
          local_38._any.signature = 0x4000029;
          if (uVar6 == 1) {
            uVar11 = 0x13f;
          }
          else if (uVar6 == 2) {
            uVar11 = 0x142;
          }
          else {
            uVar11 = uVar6 == 4 ^ 0x141;
            local_38._any.signature = 0x8000031;
            if (uVar6 < 5) {
              local_38._any.signature = 0x4000029;
            }
          }
        }
        else {
          if (0x31 < srcTypeId - 0x33) {
            return 4;
          }
          uVar11 = 0x1a2;
          if (avxEnabled) {
            uVar11 = 0x3f5;
          }
          uVar13 = 8;
          if (uVar6 != 8) {
            uVar11 = 0x18d;
            if (avxEnabled) {
              uVar11 = 0x3df;
            }
            local_38._any.signature = 0x4000029;
            uVar13 = uVar6;
          }
        }
        goto LAB_0012261d;
      }
      if (uVar6 != 8) {
        local_38._any.signature = 0x4000029;
        uVar11 = 0x18d;
        goto LAB_0012261d;
      }
LAB_0012235f:
      uVar11 = 0x1a2;
LAB_00122364:
      uVar13 = 8;
      goto LAB_0012261d;
    }
    if ((bVar1 < 5) && (bVar2 < 4)) {
      local_38._any.signature = 0x4000029;
      uVar11 = 0x1ad;
      uVar13 = uVar14;
      goto LAB_0012261d;
    }
    uVar13 = uVar12;
    if (uVar15 <= uVar12) {
      uVar13 = uVar15;
    }
    local_38._any.signature = 0x8000031;
    if (uVar13 == 4) {
      local_38._any.signature = 0x4000029;
    }
    uVar6 = local_48._any.signature & 7;
    uVar11 = 0x189;
LAB_0012245a:
    uVar7 = local_38._any.signature;
    if (uVar6 != 1) goto LAB_0012261d;
LAB_00122463:
    local_48._any.signature = uVar7;
  }
  else {
    if (dstTypeId - 0x31 < 2) {
      uVar13 = (uint)bVar1;
      if ((uint)bVar2 <= (uint)bVar1) {
        uVar13 = (uint)bVar2;
      }
      if ((9 < uVar6) && ((local_48._any.signature & 7) != 2)) {
        uVar11 = 0x1a2;
        if ((1 < srcTypeId - 0x31) && (uVar11 = 399, 0x31 < srcTypeId - 0x33)) {
          return 4;
        }
        goto LAB_0012261d;
      }
      if (uVar13 == 8) goto LAB_0012235f;
      uVar6 = local_48._any.signature & 7;
      uVar11 = 0x18d;
joined_r0x0012269f:
      if (uVar6 != 1) goto LAB_0012261d;
    }
    else {
      if (3 < dstTypeId - 0x2d) {
        if (0x31 < dstTypeId - 0x33) {
          return 4;
        }
        local_38._any.signature = 0x10000149;
        uVar11 = 0x1a3;
        if (local_48._any.signature == 0x8000289) goto LAB_0012261d;
        if (TypeId::_info[(ulong)srcTypeId + 0x80] != '+' ||
            TypeId::_info[(ulong)dstTypeId + 0x80] != '*') {
          if (TypeId::_info[(ulong)srcTypeId + 0x80] == '*' &&
              TypeId::_info[(ulong)dstTypeId + 0x80] == '+') {
            uVar6 = uVar15 * 2;
            if (uVar12 <= uVar15 * 2) {
              uVar6 = (uint)bVar1;
            }
            uVar13 = uVar6 >> 1;
            uVar10 = 0x80;
            if (avxEnabled) {
              uVar10 = 800;
            }
            uVar11 = 0x79;
            if (avxEnabled) {
              uVar11 = 0x312;
            }
            if (uVar6 < 10) {
              uVar11 = uVar10;
            }
            uVar9 = 0x40000159;
            if ((uVar6 & 0xfe) < 0x21) {
              uVar9 = 0x20000151;
            }
            local_38._any.signature = 0x10000149;
            if (0x10 < (uVar6 & 0xfe)) {
              local_38._any.signature = uVar9;
            }
            if (((local_48._any.signature & 7) == 1) && (0x3f < uVar6)) {
              local_48._any.signature = 0x20000151;
            }
            goto LAB_0012261d;
          }
          uVar13 = uVar12;
          if (uVar15 <= uVar12) {
            uVar13 = uVar15;
          }
          if ((local_48._any.signature & 0xf07) == 1 || (local_48._any.signature & 7) == 2) {
            if (uVar13 < 5) {
              uVar11 = 0x18d;
              if (avxEnabled) {
                uVar11 = 0x3df;
              }
              uVar6 = local_48._any.signature & 3;
              goto joined_r0x0012269f;
            }
            if (uVar13 == 8) {
              uVar11 = 0x1a2;
              if (avxEnabled) {
                uVar11 = 0x3f5;
              }
              goto LAB_00122364;
            }
          }
          if ((local_48._any.signature & 0xf07) != 0x101 && (local_48._any.signature & 7) != 2) {
            return 4;
          }
          uVar11 = 0x18b;
          if (avxEnabled) {
            uVar11 = 0x3de;
          }
          uVar9 = 0x40000159;
          if (uVar13 < 0x21) {
            uVar9 = 0x20000151;
          }
          local_38._any.signature = 0x10000149;
          if (0x10 < uVar13) {
            local_38._any.signature = uVar9;
          }
          uVar6 = local_48._any.signature & 3;
          goto LAB_0012245a;
        }
        uVar13 = uVar12 * 2;
        if (uVar15 <= uVar12 * 2) {
          uVar13 = uVar15;
        }
        uVar10 = 0x83;
        if (avxEnabled) {
          uVar10 = 0x324;
        }
        uVar11 = 0x7d;
        if (avxEnabled) {
          uVar11 = 0x318;
        }
        if (uVar13 < 9) {
          uVar11 = uVar10;
        }
        if ((uVar13 & 0xfe) == 0x40) {
          local_38._any.signature = 0x20000151;
        }
        if ((local_48._any.signature & 7) != 1) goto LAB_0012261d;
        uVar9 = 0x40000159;
        if (uVar13 < 0x21) {
          uVar9 = 0x20000151;
        }
        uVar7 = 0x10000149;
        if (0x10 < uVar13) {
          uVar7 = uVar9;
        }
        goto LAB_00122463;
      }
      uVar13 = uVar12;
      if (uVar15 <= uVar12) {
        uVar13 = uVar15;
      }
      if ((3 < srcTypeId - 0x2d && 9 < uVar6) && ((local_48._any.signature & 7) != 2)) {
        return 4;
      }
      if (uVar13 == 1) {
        uVar11 = 0x13f;
      }
      else if (uVar13 == 2) {
        uVar11 = 0x142;
      }
      else {
        uVar11 = uVar13 == 4 ^ 0x141;
      }
      if (((local_48._any.signature & 0xf07) != 1) || (4 < uVar13)) goto LAB_0012261d;
    }
    local_48._any.signature = 0x4000029;
  }
LAB_0012261d:
  if ((local_48._any.signature & 7) == 2) {
    local_48._any.signature = uVar13 << 0x18 | local_48._any.signature & 0xfffffa;
  }
  *(char **)(emitter + 0x40) = comment;
  EVar8 = CodeEmitter::emit((CodeEmitter *)emitter,uVar11,(Operand_ *)&local_38._any,
                            (Operand_ *)&local_48._any);
  return EVar8;
}

Assistant:

ASMJIT_FAVOR_SIZE Error X86Internal::emitArgMove(X86Emitter* emitter,
  const X86Reg& dst_, uint32_t dstTypeId,
  const Operand_& src_, uint32_t srcTypeId, bool avxEnabled, const char* comment) {

  // Deduce optional `dstTypeId`, which may be `TypeId::kVoid` in some cases.
  if (!dstTypeId) dstTypeId = x86OpData.archRegs.regTypeToTypeId[dst_.getType()];

  // Invalid or abstract TypeIds are not allowed.
  ASMJIT_ASSERT(TypeId::isValid(dstTypeId) && !TypeId::isAbstract(dstTypeId));
  ASMJIT_ASSERT(TypeId::isValid(srcTypeId) && !TypeId::isAbstract(srcTypeId));

  X86Reg dst(dst_);
  Operand src(src_);

  uint32_t dstSize = TypeId::sizeOf(dstTypeId);
  uint32_t srcSize = TypeId::sizeOf(srcTypeId);

  int32_t instId = Globals::kInvalidInstId;

  // Not a real loop, just 'break' is nicer than 'goto'.
  for (;;) {
    if (TypeId::isInt(dstTypeId)) {
      if (TypeId::isInt(srcTypeId)) {
        instId = X86Inst::kIdMovsx;
        uint32_t typeOp = (dstTypeId << 8) | srcTypeId;

        // Sign extend by using 'movsx'.
        if (typeOp == ((TypeId::kI16 << 8) | TypeId::kI8 ) ||
            typeOp == ((TypeId::kI32 << 8) | TypeId::kI8 ) ||
            typeOp == ((TypeId::kI32 << 8) | TypeId::kI16) ||
            typeOp == ((TypeId::kI64 << 8) | TypeId::kI8 ) ||
            typeOp == ((TypeId::kI64 << 8) | TypeId::kI16)) break;

        // Sign extend by using 'movsxd'.
        instId = X86Inst::kIdMovsxd;
        if (typeOp == ((TypeId::kI64 << 8) | TypeId::kI32)) break;
      }

      if (TypeId::isInt(srcTypeId) || src_.isMem()) {
        // Zero extend by using 'movzx' or 'mov'.
        if (dstSize <= 4 && srcSize < 4) {
          instId = X86Inst::kIdMovzx;
          dst.setSignature(X86Reg::signatureOfT<X86Reg::kRegGpd>());
        }
        else {
          // We should have caught all possibilities where `srcSize` is less
          // than 4, so we don't have to worry about 'movzx' anymore. Minimum
          // size is enough to determine if we want 32-bit or 64-bit move.
          instId = X86Inst::kIdMov;
          srcSize = std::min(srcSize, dstSize);

          dst.setSignature(srcSize == 4 ? X86Reg::signatureOfT<X86Reg::kRegGpd>()
                                        : X86Reg::signatureOfT<X86Reg::kRegGpq>());
          if (src.isReg()) src.setSignature(dst.getSignature());
        }
        break;
      }

      // NOTE: The previous branch caught all memory sources, from here it's
      // always register to register conversion, so catch the remaining cases.
      srcSize = std::min(srcSize, dstSize);

      if (TypeId::isMmx(srcTypeId)) {
        // 64-bit move.
        instId = X86Inst::kIdMovq;
        if (srcSize == 8) break;

        // 32-bit move.
        instId = X86Inst::kIdMovd;
        dst.setSignature(X86Reg::signatureOfT<X86Reg::kRegGpd>());
        break;
      }

      if (TypeId::isMask(srcTypeId)) {
        instId = X86Inst::kmovIdFromSize(srcSize);
        dst.setSignature(srcSize <= 4 ? X86Reg::signatureOfT<X86Reg::kRegGpd>()
                                      : X86Reg::signatureOfT<X86Reg::kRegGpq>());
        break;
      }

      if (TypeId::isVec(srcTypeId)) {
        // 64-bit move.
        instId = avxEnabled ? X86Inst::kIdVmovq : X86Inst::kIdMovq;
        if (srcSize == 8) break;

        // 32-bit move.
        instId = avxEnabled ? X86Inst::kIdVmovd : X86Inst::kIdMovd;
        dst.setSignature(X86Reg::signatureOfT<X86Reg::kRegGpd>());
        break;
      }
    }

    if (TypeId::isMmx(dstTypeId)) {
      instId = X86Inst::kIdMovq;
      srcSize = std::min(srcSize, dstSize);

      if (TypeId::isInt(srcTypeId) || src.isMem()) {
        // 64-bit move.
        if (srcSize == 8) break;

        // 32-bit move.
        instId = X86Inst::kIdMovd;
        if (src.isReg()) src.setSignature(X86Reg::signatureOfT<X86Reg::kRegGpd>());
        break;
      }

      if (TypeId::isMmx(srcTypeId)) break;

      // NOTE: This will hurt if `avxEnabled`.
      instId = X86Inst::kIdMovdq2q;
      if (TypeId::isVec(srcTypeId)) break;
    }

    if (TypeId::isMask(dstTypeId)) {
      srcSize = std::min(srcSize, dstSize);

      if (TypeId::isInt(srcTypeId) || TypeId::isMask(srcTypeId) || src.isMem()) {
        instId = X86Inst::kmovIdFromSize(srcSize);
        if (X86Reg::isGp(src) && srcSize <= 4) src.setSignature(X86Reg::signatureOfT<X86Reg::kRegGpd>());
        break;
      }
    }

    if (TypeId::isVec(dstTypeId)) {
      // By default set destination to XMM, will be set to YMM|ZMM if needed.
      dst.setSignature(X86Reg::signatureOfT<X86Reg::kRegXmm>());

      // NOTE: This will hurt if `avxEnabled`.
      if (X86Reg::isMm(src)) {
        // 64-bit move.
        instId = X86Inst::kIdMovq2dq;
        break;
      }

      // Argument conversion.
      uint32_t dstElement = TypeId::elementOf(dstTypeId);
      uint32_t srcElement = TypeId::elementOf(srcTypeId);

      if (dstElement == TypeId::kF32 && srcElement == TypeId::kF64) {
        srcSize = std::min(dstSize * 2, srcSize);
        dstSize = srcSize / 2;

        if (srcSize <= 8)
          instId = avxEnabled ? X86Inst::kIdVcvtss2sd : X86Inst::kIdCvtss2sd;
        else
          instId = avxEnabled ? X86Inst::kIdVcvtps2pd : X86Inst::kIdCvtps2pd;

        if (dstSize == 32)
          dst.setSignature(X86Reg::signatureOfT<X86Reg::kRegYmm>());
        if (src.isReg())
          src.setSignature(X86Reg::signatureOfVecBySize(srcSize));
        break;
      }

      if (dstElement == TypeId::kF64 && srcElement == TypeId::kF32) {
        srcSize = std::min(dstSize, srcSize * 2) / 2;
        dstSize = srcSize * 2;

        if (srcSize <= 4)
          instId = avxEnabled ? X86Inst::kIdVcvtsd2ss : X86Inst::kIdCvtsd2ss;
        else
          instId = avxEnabled ? X86Inst::kIdVcvtpd2ps : X86Inst::kIdCvtpd2ps;

        dst.setSignature(X86Reg::signatureOfVecBySize(dstSize));
        if (src.isReg() && srcSize >= 32)
          src.setSignature(X86Reg::signatureOfT<X86Reg::kRegYmm>());
        break;
      }

      srcSize = std::min(srcSize, dstSize);
      if (X86Reg::isGp(src) || src.isMem()) {
        // 32-bit move.
        if (srcSize <= 4) {
          instId = avxEnabled ? X86Inst::kIdVmovd : X86Inst::kIdMovd;
          if (src.isReg()) src.setSignature(X86Reg::signatureOfT<X86Reg::kRegGpd>());
          break;
        }

        // 64-bit move.
        if (srcSize == 8) {
          instId = avxEnabled ? X86Inst::kIdVmovq : X86Inst::kIdMovq;
          break;
        }
      }

      if (X86Reg::isVec(src) || src.isMem()) {
        instId = avxEnabled ? X86Inst::kIdVmovaps : X86Inst::kIdMovaps;
        uint32_t sign = X86Reg::signatureOfVecBySize(srcSize);

        dst.setSignature(sign);
        if (src.isReg()) src.setSignature(sign);
        break;
      }
    }

    return DebugUtils::errored(kErrorInvalidState);
  }

  if (src.isMem())
    src.as<X86Mem>().setSize(srcSize);

  emitter->setInlineComment(comment);
  return emitter->emit(instId, dst, src);
}